

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

char * __thiscall rtosc::Port::MetaContainer::operator[](MetaContainer *this,char *str)

{
  int iVar1;
  char *__s1;
  MetaIterator MVar2;
  MetaIterator __begin1;
  MetaIterator local_38;
  
  local_38 = begin(this);
  __s1 = local_38.title;
  MVar2 = end(this);
  while( true ) {
    if (__s1 == MVar2.title) {
      return (char *)0x0;
    }
    iVar1 = strcmp(__s1,str);
    if (iVar1 == 0) break;
    MetaIterator::operator++(&local_38);
    __s1 = local_38.title;
  }
  return local_38.value;
}

Assistant:

const char *Port::MetaContainer::operator[](const char *str) const
{
    for(const auto x : *this)
        if(!strcmp(x.title, str))
            return x.value;
    return NULL;
}